

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::BeginInstance(CWriter *this)

{
  Import *import_00;
  bool bVar1;
  ExternalKind EVar2;
  vector<wabt::Import_*,_std::allocator<wabt::Import_*>_> *this_00;
  reference ppIVar3;
  reference ppIVar4;
  GlobalImport *pGVar5;
  MemoryImport *pMVar6;
  TableImport *pTVar7;
  Table *pTVar8;
  Memory *memory;
  char *in_R9;
  char *pcVar9;
  string_view sVar10;
  string_view sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  string_view module_name;
  string_view module_name_00;
  string_view module_name_01;
  string_view module_name_02;
  string_view module_name_03;
  string_view module_name_04;
  string_view module_name_05;
  string_view export_name;
  string_view export_name_00;
  string_view export_name_01;
  string_view export_name_02;
  string local_480;
  allocator<char> local_459;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  Table *local_418;
  Table *table;
  size_t local_408;
  undefined1 local_400 [16];
  string local_3f0;
  allocator<char> local_3c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  Table *local_388;
  size_t local_380;
  undefined1 local_378 [16];
  string local_368;
  allocator<char> local_341;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  Newline local_2f9;
  undefined1 local_2f8 [16];
  string local_2e8;
  undefined1 local_2c8 [16];
  string local_2b8;
  Import *local_298;
  Import *import_2;
  iterator __end2_4;
  iterator __begin2_4;
  vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_> *__range2_4;
  GlobalName local_270;
  undefined1 local_260 [16];
  string local_250;
  reference local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *import_module_1;
  iterator __end2_3;
  iterator __begin2_3;
  SymbolSet *__range2_3;
  string local_208;
  Newline local_1e1;
  undefined1 local_1e0 [16];
  string local_1d0;
  char *local_1b0;
  size_t local_1a8;
  undefined1 local_1a0 [16];
  string local_190;
  string local_170;
  string_view local_150;
  Type local_140;
  Global *local_138;
  Global *global;
  Import *local_120;
  Import *import_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_> *__range2_2;
  undefined1 local_f8 [16];
  string local_e8;
  string_view local_c8;
  string local_b8;
  reference local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *import_module;
  iterator __end2_1;
  iterator __begin2_1;
  SymbolSet *__range2_1;
  Import *import;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Import_*,_std::allocator<wabt::Import_*>_> *__range2;
  string local_30;
  CWriter *local_10;
  CWriter *this_local;
  
  local_10 = this;
  bVar1 = std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>::empty
                    (&this->module_->imports);
  if (bVar1) {
    (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_(&local_30,(CWriter *)this);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[16],std::__cxx11::string,char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,(char (*) [16])"typedef struct ",&local_30,(char (*) [2])0x36dfa4,
               (OpenBrace *)((long)&__range2 + 7));
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    ComputeUniqueImports(this);
    this_00 = &this->module_->imports;
    __end2 = std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>::begin(this_00);
    import = (Import *)std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wabt::Import_*const_*,_std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>_>
                                       *)&import), bVar1) {
      ppIVar3 = __gnu_cxx::
                __normal_iterator<wabt::Import_*const_*,_std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>_>
                ::operator*(&__end2);
      import_00 = *ppIVar3;
      sVar11 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)&import_00->module_name);
      sVar10 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)&import_00->field_name);
      in_R9 = sVar10._M_str;
      DefineImportName(this,import_00,sVar11,sVar10);
      __gnu_cxx::
      __normal_iterator<wabt::Import_*const_*,_std::vector<wabt::Import_*,_std::allocator<wabt::Import_*>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->import_module_set_);
    import_module =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->import_module_set_);
    while( true ) {
      bVar1 = std::operator!=(&__end2_1,(_Self *)&import_module);
      if (!bVar1) break;
      local_98 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2_1);
      sVar11 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
      pcVar9 = sVar11._M_str;
      local_c8 = sVar11;
      (anonymous_namespace)::CWriter::DefineImportedModuleInstanceName_abi_cxx11_
                (&local_b8,(CWriter *)this,sVar11);
      std::__cxx11::string::~string((string *)&local_b8);
      auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
      module_name._M_len = auVar12._8_8_;
      module_name._M_str = pcVar9;
      local_f8 = auVar12;
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                (&local_e8,auVar12._0_8_,module_name);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[8],std::__cxx11::string,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [8])0x37c51d,&local_e8,(char (*) [2])0x37ca1e,
                 (Newline *)((long)&__range2_2 + 7));
      std::__cxx11::string::~string((string *)&local_e8);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_1);
    }
    __end2_2 = std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::begin
                         (&this->unique_imports_);
    import_1 = (Import *)
               std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::end
                         (&this->unique_imports_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_2,
                         (__normal_iterator<const_wabt::Import_**,_std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>_>
                          *)&import_1);
      if (!bVar1) break;
      ppIVar4 = __gnu_cxx::
                __normal_iterator<const_wabt::Import_**,_std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>_>
                ::operator*(&__end2_2);
      local_120 = *ppIVar4;
      EVar2 = Import::kind(local_120);
      if (EVar2 != First) {
        EVar2 = Import::kind(local_120);
        if (EVar2 != Last) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&global,"extern ");
          Write(this,_global);
          EVar2 = Import::kind(local_120);
          if (EVar2 == Table) {
            pTVar7 = cast<wabt::TableImport,wabt::Import>(local_120);
            WriteTableType(this,&(pTVar7->table).elem_type);
          }
          else if (EVar2 == Memory) {
            pMVar6 = cast<wabt::MemoryImport,wabt::Import>(local_120);
            (anonymous_namespace)::GetMemoryTypeString_abi_cxx11_
                      (&local_170,(_anonymous_namespace_ *)&pMVar6->memory,memory);
            sVar11 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_170);
            local_150 = sVar11;
            Write(this,sVar11);
            std::__cxx11::string::~string((string *)&local_170);
          }
          else {
            if (EVar2 != Global) {
              abort();
            }
            pGVar5 = cast<wabt::GlobalImport,wabt::Import>(local_120);
            local_138 = &pGVar5->global;
            local_140 = (pGVar5->global).type;
            Write(this,local_140);
          }
          auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&local_120->module_name);
          local_1a0 = auVar12;
          auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&local_120->field_name);
          local_1a8 = auVar12._8_8_;
          pcVar9 = auVar12._0_8_;
          module_name_00._M_str = pcVar9;
          module_name_00._M_len = local_1a0._8_8_;
          export_name._M_str = in_R9;
          export_name._M_len = local_1a8;
          local_1b0 = pcVar9;
          (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                    (&local_190,(CWriter *)local_1a0._0_8_,module_name_00,export_name);
          auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&local_120->module_name);
          module_name_01._M_len = auVar12._8_8_;
          module_name_01._M_str = pcVar9;
          local_1e0 = auVar12;
          (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                    (&local_1d0,auVar12._0_8_,module_name_01);
          in_R9 = "*);";
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[3],std::__cxx11::string,char_const(&)[9],std::__cxx11::string,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [3])0x37c056,&local_190,(char (*) [9])"(struct ",
                     &local_1d0,(char (*) [4])"*);",&local_1e1);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_190);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_wabt::Import_**,_std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>_>
      ::operator++(&__end2_2);
    }
    Write(this);
    (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_(&local_208,(CWriter *)this);
    pTVar8 = (Table *)0x36dfa4;
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[16],std::__cxx11::string,char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,(char (*) [16])"typedef struct ",&local_208,(char (*) [2])0x36dfa4,
               (OpenBrace *)((long)&__range2_3 + 7));
    std::__cxx11::string::~string((string *)&local_208);
    __end2_3 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->import_func_module_set_);
    import_module_1 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->import_func_module_set_);
    while( true ) {
      bVar1 = std::operator!=(&__end2_3,(_Self *)&import_module_1);
      if (!bVar1) break;
      local_230 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end2_3);
      auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_230);
      module_name_02._M_len = auVar12._8_8_;
      module_name_02._M_str = (char *)pTVar8;
      local_260 = auVar12;
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                (&local_250,auVar12._0_8_,module_name_02);
      GlobalName::GlobalName(&local_270,Import,local_230);
      pTVar8 = (Table *)0x37c056;
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[8],std::__cxx11::string,char_const(&)[3],wabt::(anonymous_namespace)::GlobalName,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [8])0x37c51d,&local_250,(char (*) [3])0x37c056,&local_270
                 ,(char (*) [2])0x37ca1e,(Newline *)((long)&__range2_4 + 7));
      std::__cxx11::string::~string((string *)&local_250);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_3);
    }
    __end2_4 = std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::begin
                         (&this->unique_imports_);
    import_2 = (Import *)
               std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::end
                         (&this->unique_imports_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_4,
                         (__normal_iterator<const_wabt::Import_**,_std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>_>
                          *)&import_2);
      if (!bVar1) break;
      ppIVar4 = __gnu_cxx::
                __normal_iterator<const_wabt::Import_**,_std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>_>
                ::operator*(&__end2_4);
      local_298 = *ppIVar4;
      EVar2 = Import::kind(local_298);
      if (EVar2 != First) {
        EVar2 = Import::kind(local_298);
        if (EVar2 != Last) {
          auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&local_298->module_name);
          sVar11._M_len = auVar12._8_8_;
          sVar11._M_str = (char *)pTVar8;
          local_2c8 = auVar12;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_(&local_2b8,auVar12._0_8_,sVar11);
          auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&local_298->field_name);
          sVar10._M_len = auVar12._8_8_;
          sVar10._M_str = (char *)pTVar8;
          local_2f8 = auVar12;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_(&local_2e8,auVar12._0_8_,sVar10);
          pcVar9 = "\' */";
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[13],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[5],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [13])"/* import: \'",&local_2b8,(char (*) [4])"\' \'"
                     ,&local_2e8,(char (*) [5])"\' */",&local_2f9);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_2b8);
          EVar2 = Import::kind(local_298);
          if (EVar2 == Table) {
            pTVar7 = cast<wabt::TableImport,wabt::Import>(local_298);
            local_418 = &pTVar7->table;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"*",&local_459);
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&local_298->module_name);
            module_name_05._M_len = auVar12._8_8_;
            auVar13 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&local_298->field_name);
            pTVar8 = auVar13._0_8_;
            module_name_05._M_str = (char *)pTVar8;
            export_name_02._M_str = pcVar9;
            export_name_02._M_len = auVar13._8_8_;
            (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                      (&local_480,auVar12._0_8_,module_name_05,export_name_02);
            std::operator+(&local_438,&local_458,&local_480);
            WriteTable(this,&local_438,&local_418->elem_type);
            std::__cxx11::string::~string((string *)&local_438);
            std::__cxx11::string::~string((string *)&local_480);
            std::__cxx11::string::~string((string *)&local_458);
            std::allocator<char>::~allocator(&local_459);
          }
          else if (EVar2 == Memory) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"*",&local_3c9);
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&local_298->module_name);
            local_400 = auVar12;
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&local_298->field_name);
            local_408 = auVar12._8_8_;
            pTVar8 = auVar12._0_8_;
            module_name_04._M_str = (char *)pTVar8;
            module_name_04._M_len = local_400._8_8_;
            export_name_01._M_str = pcVar9;
            export_name_01._M_len = local_408;
            table = pTVar8;
            (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                      (&local_3f0,(CWriter *)local_400._0_8_,module_name_04,export_name_01);
            std::operator+(&local_3a8,&local_3c8,&local_3f0);
            pMVar6 = cast<wabt::MemoryImport,wabt::Import>(local_298);
            WriteMemory(this,&local_3a8,&pMVar6->memory);
            std::__cxx11::string::~string((string *)&local_3a8);
            std::__cxx11::string::~string((string *)&local_3f0);
            std::__cxx11::string::~string((string *)&local_3c8);
            std::allocator<char>::~allocator(&local_3c9);
          }
          else {
            if (EVar2 != Global) {
              abort();
            }
            pGVar5 = cast<wabt::GlobalImport,wabt::Import>(local_298);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"*",&local_341);
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&local_298->module_name);
            local_378 = auVar12;
            auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&local_298->field_name);
            local_380 = auVar12._8_8_;
            pTVar8 = auVar12._0_8_;
            module_name_03._M_str = (char *)pTVar8;
            module_name_03._M_len = local_378._8_8_;
            export_name_00._M_str = pcVar9;
            export_name_00._M_len = local_380;
            local_388 = pTVar8;
            (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                      (&local_368,(CWriter *)local_378._0_8_,module_name_03,export_name_00);
            std::operator+(&local_320,&local_340,&local_368);
            WriteGlobal(this,&pGVar5->global,&local_320);
            std::__cxx11::string::~string((string *)&local_320);
            std::__cxx11::string::~string((string *)&local_368);
            std::__cxx11::string::~string((string *)&local_340);
            std::allocator<char>::~allocator(&local_341);
          }
          Write(this);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_wabt::Import_**,_std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>_>
      ::operator++(&__end2_4);
    }
  }
  return;
}

Assistant:

void CWriter::BeginInstance() {
  if (module_->imports.empty()) {
    Write("typedef struct ", ModuleInstanceTypeName(), " ", OpenBrace());
    return;
  }

  ComputeUniqueImports();

  // define names of per-instance imports
  for (const Import* import : module_->imports) {
    DefineImportName(import, import->module_name, import->field_name);
  }

  // Forward declaring module instance types
  for (const auto& import_module : import_module_set_) {
    DefineImportedModuleInstanceName(import_module);
    Write("struct ", ModuleInstanceTypeName(import_module), ";", Newline());
  }

  // Forward declaring module imports
  for (const Import* import : unique_imports_) {
    if ((import->kind() == ExternalKind::Func) ||
        (import->kind() == ExternalKind::Tag)) {
      continue;
    }

    Write("extern ");
    switch (import->kind()) {
      case ExternalKind::Global: {
        const Global& global = cast<GlobalImport>(import)->global;
        Write(global.type);
        break;
      }

      case ExternalKind::Memory: {
        Write(GetMemoryTypeString(cast<MemoryImport>(import)->memory));
        break;
      }

      case ExternalKind::Table:
        WriteTableType(cast<TableImport>(import)->table.elem_type);
        break;

      default:
        WABT_UNREACHABLE;
    }
    Write("* ", ExportName(import->module_name, import->field_name), "(struct ",
          ModuleInstanceTypeName(import->module_name), "*);", Newline());
  }
  Write(Newline());

  // Add pointers to module instances that any func is imported from,
  // so that imported functions can be given their own module instances
  // when invoked
  Write("typedef struct ", ModuleInstanceTypeName(), " ", OpenBrace());
  for (const auto& import_module : import_func_module_set_) {
    Write("struct ", ModuleInstanceTypeName(import_module), "* ",
          GlobalName(ModuleFieldType::Import, import_module), ";", Newline());
  }

  for (const Import* import : unique_imports_) {
    if ((import->kind() == ExternalKind::Func) ||
        (import->kind() == ExternalKind::Tag)) {
      continue;
    }

    Write("/* import: '", SanitizeForComment(import->module_name), "' '",
          SanitizeForComment(import->field_name), "' */", Newline());

    switch (import->kind()) {
      case ExternalKind::Global:
        WriteGlobal(cast<GlobalImport>(import)->global,
                    std::string("*") +
                        ExportName(import->module_name, import->field_name));
        break;

      case ExternalKind::Memory:
        WriteMemory(std::string("*") +
                        ExportName(import->module_name, import->field_name),
                    cast<MemoryImport>(import)->memory);
        break;

      case ExternalKind::Table: {
        const Table& table = cast<TableImport>(import)->table;
        WriteTable(std::string("*") +
                       ExportName(import->module_name, import->field_name),
                   table.elem_type);
      } break;

      default:
        WABT_UNREACHABLE;
    }

    Write(Newline());
  }
}